

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void Shutdown(NodeContext *node)

{
  ArgsManager **val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  CTxMemPool *pCVar3;
  pointer puVar4;
  PeerManager *pPVar5;
  ValidationSignals *pVVar6;
  CConnman *this;
  ChainstateManager *pCVar7;
  CScheduler *this_00;
  NetGroupManager *__ptr_00;
  CBlockPolicyEstimator *pCVar8;
  CoinsViews *pCVar9;
  pointer ppBVar10;
  Chainstate *this_01;
  _Head_base<0UL,_CoinsViews_*,_false> __ptr_01;
  ChainClient *pCVar11;
  _Head_base<0UL,_kernel::Context_*,_false> _Var12;
  FopenFn mockable_fopen_function;
  size_type sVar13;
  bool bVar14;
  char cVar15;
  pointer *__ptr;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *this_02;
  pointer puVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  _Alloc_hider _Var17;
  unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_> *client;
  pointer ppBVar18;
  pointer puVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_04;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  Level in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  code *in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff28) [9];
  code *pcVar20;
  error_code error;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock_shutdown;
  size_type __dnew;
  long local_90 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  undefined1 local_70 [16];
  path pid_path;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (Shutdown(node::NodeContext&)::g_shutdown_mutex == '\0') {
    Shutdown();
  }
  lock_shutdown.super_unique_lock._M_device = &Shutdown::g_shutdown_mutex.super_mutex;
  lock_shutdown.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::try_lock(&lock_shutdown.super_unique_lock);
  if (lock_shutdown.super_unique_lock._M_owns != false) {
    logging_function._M_str = "Shutdown";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file._M_len = 0x51;
    LogPrintf_<char[9]>(logging_function,source_file,0x111,
                        I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PRUNE|REINDEX|
                        SELECTCOINS|ADDRMAN|ESTIMATEFEE|WALLETDB|ZMQ|BENCH|HTTP|MEMPOOL|TOR|NET,
                        in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff28);
    val = &node->args;
    inline_assertion_check<true,ArgsManager*&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp",
               0x112,"Shutdown","node.args");
    paVar1 = &pid_path.super_path._M_pathname.field_2;
    pid_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pid_path,"shutoff","");
    util::ThreadRename((string *)&pid_path);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pid_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(pid_path.super_path._M_pathname._M_dataplus._M_p,
                      pid_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
    }
    pCVar3 = (node->mempool)._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    if (pCVar3 != (CTxMemPool *)0x0) {
      CTxMemPool::AddTransactionsUpdated(pCVar3,1);
    }
    StopHTTPRPC();
    StopREST();
    StopRPC();
    StopHTTPServer();
    puVar4 = (node->chain_clients).
             super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (node->chain_clients).
                   super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar4;
        puVar19 = puVar19 + 1) {
      (*((puVar19->_M_t).
         super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
         ._M_t.
         super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
         .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl)->_vptr_ChainClient
        [6])();
    }
    StopMapPort();
    pPVar5 = (node->peerman)._M_t.
             super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
             super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
             super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
    if ((pPVar5 != (PeerManager *)0x0) &&
       (pVVar6 = (node->validation_signals)._M_t.
                 super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                 .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl,
       pVVar6 != (ValidationSignals *)0x0)) {
      ValidationSignals::UnregisterValidationInterface(pVVar6,&pPVar5->super_CValidationInterface);
    }
    this = (node->connman)._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t
           .super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
           super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
    if (this != (CConnman *)0x0) {
      CConnman::StopThreads(this);
      CConnman::StopNodes(this);
    }
    StopTorControl();
    pCVar7 = (node->chainman)._M_t.
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
    if ((pCVar7 != (ChainstateManager *)0x0) && ((pCVar7->m_thread_load)._M_id._M_thread != 0)) {
      std::thread::join();
    }
    this_00 = (node->scheduler)._M_t.
              super___uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>._M_t.
              super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
              super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl;
    if (this_00 != (CScheduler *)0x0) {
      CScheduler::stop(this_00);
    }
    pPVar5 = (node->peerman)._M_t.
             super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
             super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
             super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
    (node->peerman)._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
    super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl = (PeerManager *)0x0;
    if (pPVar5 != (PeerManager *)0x0) {
      (*(pPVar5->super_CValidationInterface)._vptr_CValidationInterface[0xb])();
    }
    this_04 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node->mempool;
    std::__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>::reset
              ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&node->connman,
               (pointer)0x0);
    std::__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>::reset
              ((__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> *)&node->banman,(pointer)0x0);
    std::__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>::reset
              ((__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> *)&node->addrman,
               (pointer)0x0);
    __ptr_00 = (node->netgroupman)._M_t.
               super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
               .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
    (node->netgroupman)._M_t.
    super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
    super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
    super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl = (NetGroupManager *)0x0;
    if (__ptr_00 != (NetGroupManager *)0x0) {
      std::default_delete<const_NetGroupManager>::operator()
                ((default_delete<const_NetGroupManager> *)&node->netgroupman,__ptr_00);
    }
    pCVar3 = (((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_04)->_M_t).
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    if (((pCVar3 != (CTxMemPool *)0x0) && (bVar14 = CTxMemPool::GetLoadTried(pCVar3), bVar14)) &&
       (bVar14 = ::node::ShouldPersistMempool(*val), bVar14)) {
      pCVar3 = (((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_04)->_M_t).
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
      ::node::MempoolPath(&pid_path,*val);
      in_stack_ffffffffffffff28 = (char (*) [9])0x0;
      in_stack_ffffffffffffff20 = fsbridge::fopen;
      pcVar20 = std::
                _Function_handler<_IO_FILE_*(const_fs::path_&,_const_char_*),__IO_FILE_*(*)(const_fs::path_&,_const_char_*)>
                ::_M_manager;
      mockable_fopen_function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffff1c;
      mockable_fopen_function.super__Function_base._M_functor._0_4_ = in_stack_ffffffffffffff18;
      mockable_fopen_function.super__Function_base._M_functor._8_8_ = fsbridge::fopen;
      mockable_fopen_function.super__Function_base._M_manager = (_Manager_type)0x0;
      mockable_fopen_function._M_invoker =
           std::
           _Function_handler<_IO_FILE_*(const_fs::path_&,_const_char_*),__IO_FILE_*(*)(const_fs::path_&,_const_char_*)>
           ::_M_manager;
      ::node::DumpMempool(pCVar3,&pid_path,mockable_fopen_function,SUB81(&stack0xffffffffffffff20,0)
                         );
      if (pcVar20 != (code *)0x0) {
        (*pcVar20)(&stack0xffffffffffffff20,&stack0xffffffffffffff20,3);
      }
      std::filesystem::__cxx11::path::~path(&pid_path.super_path);
    }
    pCVar8 = (node->fee_estimator)._M_t.
             super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
             ._M_t.
             super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
             .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
    if (pCVar8 != (CBlockPolicyEstimator *)0x0) {
      CBlockPolicyEstimator::Flush(pCVar8);
      pVVar6 = (node->validation_signals)._M_t.
               super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
               _M_t.
               super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
               super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
      if (pVVar6 != (ValidationSignals *)0x0) {
        ValidationSignals::UnregisterValidationInterface
                  (pVVar6,&((node->fee_estimator)._M_t.
                            super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
                            .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl)->
                           super_CValidationInterface);
      }
    }
    this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node->chainman;
    if ((((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_03)->_M_t).
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      criticalblock22.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock22.super_unique_lock._8_8_ =
           criticalblock22.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock22.super_unique_lock);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path,
                 (((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_03
                  )->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      sVar13 = pid_path.super_path._M_pathname._M_string_length;
      for (_Var17 = pid_path.super_path._M_pathname._M_dataplus; _Var17._M_p != (pointer)sVar13;
          _Var17._M_p = _Var17._M_p + 8) {
        pCVar9 = ((*(Chainstate **)_Var17._M_p)->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar9 != (CoinsViews *)0x0) &&
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar9->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> !=
            (CCoinsViewCache *)0x0)) {
          Chainstate::ForceFlushStateToDisk(*(Chainstate **)_Var17._M_p);
        }
      }
      if (pid_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(pid_path.super_path._M_pathname._M_dataplus._M_p,
                        pid_path.super_path._M_pathname.field_2._M_allocated_capacity -
                        (long)pid_path.super_path._M_pathname._M_dataplus._M_p);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
    }
    pVVar6 = (node->validation_signals)._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (pVVar6 != (ValidationSignals *)0x0) {
      ValidationSignals::FlushBackgroundCallbacks(pVVar6);
    }
    ppBVar10 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (ppBVar18 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppBVar18 != ppBVar10;
        ppBVar18 = ppBVar18 + 1) {
      BaseIndex::Stop(*ppBVar18);
    }
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      std::__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>::reset
                ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_> *)&g_txindex,(pointer)0x0)
      ;
    }
    if ((__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)
        g_coin_stats_index._M_t.
        super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
        super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
        super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)0x0) {
      std::__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>::reset
                ((__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_> *)
                 &g_coin_stats_index,(pointer)0x0);
    }
    DestroyAllBlockFilterIndexes();
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    ppBVar18 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppBVar18) {
      (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppBVar18;
    }
    if ((((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_03)->_M_t).
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      criticalblock22.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock22.super_unique_lock._8_8_ =
           criticalblock22.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock22.super_unique_lock);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path,
                 (((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_03
                  )->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      sVar13 = pid_path.super_path._M_pathname._M_string_length;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      for (_Var17 = pid_path.super_path._M_pathname._M_dataplus; _Var17._M_p != (pointer)sVar13;
          _Var17._M_p = _Var17._M_p + 8) {
        this_01 = *(Chainstate **)_Var17._M_p;
        pCVar9 = (this_01->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar9 != (CoinsViews *)0x0) &&
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar9->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> !=
            (CCoinsViewCache *)0x0)) {
          Chainstate::ForceFlushStateToDisk(this_01);
          this_02 = &this_01->m_coins_views;
          __ptr_01._M_head_impl =
               (this_02->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
               _M_t.super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
               super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
          (this_02->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
          super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
          super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl = (CoinsViews *)0x0;
          if (__ptr_01._M_head_impl != (CoinsViews *)0x0) {
            std::default_delete<CoinsViews>::operator()
                      ((default_delete<CoinsViews> *)this_02,__ptr_01._M_head_impl);
          }
        }
        args = this_04;
      }
      if (pid_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(pid_path.super_path._M_pathname._M_dataplus._M_p,
                        pid_path.super_path._M_pathname.field_2._M_allocated_capacity -
                        (long)pid_path.super_path._M_pathname._M_dataplus._M_p);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
    }
    puVar19 = (node->chain_clients).
              super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (node->chain_clients).
             super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar19 != puVar4) {
      do {
        (*((puVar19->_M_t).
           super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
           ._M_t.
           super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
           .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl)->_vptr_ChainClient
          [7])();
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar4);
      puVar19 = (node->chain_clients).
                super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (node->chain_clients).
               super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar16 = puVar19;
      if (puVar4 != puVar19) {
        do {
          pCVar11 = (puVar16->_M_t).
                    super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
                    .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl;
          if (pCVar11 != (ChainClient *)0x0) {
            (*pCVar11->_vptr_ChainClient[1])();
          }
          (puVar16->_M_t).
          super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
          ._M_t.
          super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
          .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl = (ChainClient *)0x0
          ;
          puVar16 = puVar16 + 1;
        } while (puVar16 != puVar4);
        (node->chain_clients).
        super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar19;
        args = this_03;
      }
    }
    pVVar6 = (node->validation_signals)._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (pVVar6 != (ValidationSignals *)0x0) {
      ValidationSignals::UnregisterAllValidationInterfaces(pVVar6);
    }
    pCVar3 = (CTxMemPool *)(this_04->_M_dataplus)._M_p;
    (this_04->_M_dataplus)._M_p = (pointer)0x0;
    if (pCVar3 != (CTxMemPool *)0x0) {
      std::default_delete<CTxMemPool>::operator()((default_delete<CTxMemPool> *)this_04,pCVar3);
    }
    pCVar8 = (node->fee_estimator)._M_t.
             super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
             ._M_t.
             super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
             .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
    (node->fee_estimator)._M_t.
    super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
    super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
    super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
         (CBlockPolicyEstimator *)0x0;
    if (pCVar8 != (CBlockPolicyEstimator *)0x0) {
      (*(pCVar8->super_CValidationInterface)._vptr_CValidationInterface[0xb])();
    }
    std::__uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>::reset
              ((__uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               this_03,(pointer)0x0);
    std::__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>::reset
              ((__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               &node->validation_signals,(pointer)0x0);
    std::__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>::reset
              ((__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> *)&node->scheduler,
               (pointer)0x0);
    std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
              ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)&node->ecc_context
               ,(pointer)0x0);
    _Var12._M_head_impl =
         (node->kernel)._M_t.
         super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
         super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
         super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl;
    (node->kernel)._M_t.
    super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
    super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
    super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = (Context *)0x0;
    if (_Var12._M_head_impl != (Context *)0x0) {
      operator_delete(_Var12._M_head_impl,1);
    }
    if (g_generated_pid == '\x01') {
      GetPidFile(&pid_path,*val);
      error._M_value = 0;
      error._M_cat = (error_category *)std::_V2::system_category();
      cVar15 = std::filesystem::remove((path *)&pid_path,&error);
      if (cVar15 == '\0') {
        if (error._M_value == 0) {
          criticalblock22.super_unique_lock._M_device = (mutex_type *)local_70;
          __dnew = 0x13;
          criticalblock22.super_unique_lock._M_device =
               (mutex_type *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &criticalblock22,&__dnew,0);
          local_70._0_8_ = __dnew;
          ((criticalblock22.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__lock = 0x656c6946;
          ((criticalblock22.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__count = 0x656f6420;
          ((criticalblock22.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__owner = 0x6f6e2073;
          ((criticalblock22.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__nusers = 0x78652074;
          *(undefined4 *)
           ((long)&((criticalblock22.super_unique_lock._M_device)->super___recursive_mutex_base).
                   _M_mutex.__data.__nusers + 3) = 0x74736978;
          criticalblock22.super_unique_lock._8_8_ = __dnew;
          ((criticalblock22.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __size[__dnew] = '\0';
        }
        else {
          (**(code **)(*(long *)error._M_cat + 0x20))(&criticalblock22);
        }
        __dnew = (size_type)local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__dnew,pid_path.super_path._M_pathname._M_dataplus._M_p,
                   pid_path.super_path._M_pathname._M_dataplus._M_p +
                   pid_path.super_path._M_pathname._M_string_length);
        logging_function_00._M_str = "RemovePidFile";
        logging_function_00._M_len = 0xd;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
        source_file_00._M_len = 0x51;
        LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xc2,
                   I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|RAND|REINDEX|
                   SELECTCOINS|WALLETDB|ZMQ,(Level)(string *)&__dnew,(char *)&criticalblock22,args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff20);
        if ((long *)__dnew != local_90) {
          operator_delete((void *)__dnew,local_90[0] + 1);
        }
        if (criticalblock22.super_unique_lock._M_device != (mutex_type *)local_70) {
          operator_delete(criticalblock22.super_unique_lock._M_device,local_70._0_8_ + 1);
        }
      }
      std::filesystem::__cxx11::path::~path(&pid_path.super_path);
    }
    logging_function_01._M_str = "Shutdown";
    logging_function_01._M_len = 8;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file_01._M_len = 0x51;
    LogPrintf_<char[9]>(logging_function_01,source_file_01,0x183,
                        I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PRUNE|REINDEX|
                        SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|BENCH|HTTP|TOR|NET,(Level)args,
                        (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock_shutdown.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Shutdown(NodeContext& node)
{
    static Mutex g_shutdown_mutex;
    TRY_LOCK(g_shutdown_mutex, lock_shutdown);
    if (!lock_shutdown) return;
    LogPrintf("%s: In progress...\n", __func__);
    Assert(node.args);

    /// Note: Shutdown() must be able to handle cases in which initialization failed part of the way,
    /// for example if the data directory was found to be locked.
    /// Be sure that anything that writes files or flushes caches only does this if the respective
    /// module was initialized.
    util::ThreadRename("shutoff");
    if (node.mempool) node.mempool->AddTransactionsUpdated(1);

    StopHTTPRPC();
    StopREST();
    StopRPC();
    StopHTTPServer();
    for (const auto& client : node.chain_clients) {
        client->flush();
    }
    StopMapPort();

    // Because these depend on each-other, we make sure that neither can be
    // using the other before destroying them.
    if (node.peerman && node.validation_signals) node.validation_signals->UnregisterValidationInterface(node.peerman.get());
    if (node.connman) node.connman->Stop();

    StopTorControl();

    if (node.chainman && node.chainman->m_thread_load.joinable()) node.chainman->m_thread_load.join();
    // After everything has been shut down, but before things get flushed, stop the
    // the scheduler. After this point, SyncWithValidationInterfaceQueue() should not be called anymore
    // as this would prevent the shutdown from completing.
    if (node.scheduler) node.scheduler->stop();

    // After the threads that potentially access these pointers have been stopped,
    // destruct and reset all to nullptr.
    node.peerman.reset();
    node.connman.reset();
    node.banman.reset();
    node.addrman.reset();
    node.netgroupman.reset();

    if (node.mempool && node.mempool->GetLoadTried() && ShouldPersistMempool(*node.args)) {
        DumpMempool(*node.mempool, MempoolPath(*node.args));
    }

    // Drop transactions we were still watching, record fee estimations and unregister
    // fee estimator from validation interface.
    if (node.fee_estimator) {
        node.fee_estimator->Flush();
        if (node.validation_signals) {
            node.validation_signals->UnregisterValidationInterface(node.fee_estimator.get());
        }
    }

    // FlushStateToDisk generates a ChainStateFlushed callback, which we should avoid missing
    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
            }
        }
    }

    // After there are no more peers/RPC left to give us new data which may generate
    // CValidationInterface callbacks, flush them...
    if (node.validation_signals) node.validation_signals->FlushBackgroundCallbacks();

    // Stop and delete all indexes only after flushing background callbacks.
    for (auto* index : node.indexes) index->Stop();
    if (g_txindex) g_txindex.reset();
    if (g_coin_stats_index) g_coin_stats_index.reset();
    DestroyAllBlockFilterIndexes();
    node.indexes.clear(); // all instances are nullptr now

    // Any future callbacks will be dropped. This should absolutely be safe - if
    // missing a callback results in an unrecoverable situation, unclean shutdown
    // would too. The only reason to do the above flushes is to let the wallet catch
    // up with our current chain to avoid any strange pruning edge cases and make
    // next startup faster by avoiding rescan.

    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
                chainstate->ResetCoinsViews();
            }
        }
    }
    for (const auto& client : node.chain_clients) {
        client->stop();
    }

#ifdef ENABLE_ZMQ
    if (g_zmq_notification_interface) {
        if (node.validation_signals) node.validation_signals->UnregisterValidationInterface(g_zmq_notification_interface.get());
        g_zmq_notification_interface.reset();
    }
#endif

    node.chain_clients.clear();
    if (node.validation_signals) {
        node.validation_signals->UnregisterAllValidationInterfaces();
    }
    node.mempool.reset();
    node.fee_estimator.reset();
    node.chainman.reset();
    node.validation_signals.reset();
    node.scheduler.reset();
    node.ecc_context.reset();
    node.kernel.reset();

    RemovePidFile(*node.args);

    LogPrintf("%s: done\n", __func__);
}